

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

Gia_Man_t * Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *p,int fUseFanout,int fXorTrick)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *p_00;
  char *pcVar9;
  Tim_Man_t *pTVar10;
  Gia_Man_t *pGVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  bool bVar15;
  Vec_Int_t *local_58;
  int local_50;
  Vec_Int_t *vCarries;
  Gia_Man_t *local_38;
  
  local_50 = Gia_ManBoxNum(p);
  vCarries = (Vec_Int_t *)0x0;
  Gia_ManCleanPhase(p);
  iVar14 = 0;
  while ((iVar14 < p->vCis->nSize && (pGVar8 = Gia_ManCi(p,iVar14), pGVar8 != (Gia_Obj_t *)0x0))) {
    iVar14 = iVar14 + 1;
    if (((undefined1  [12])*pGVar8 & (undefined1  [12])0x4000000040000000) != (undefined1  [12])0x0)
    {
      __assert_fail("!pObj->fMark0 && !pObj->fMark1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                    ,0x36c,"Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
    }
  }
  iVar14 = 0;
  while ((iVar14 < p->vCos->nSize && (pGVar8 = Gia_ManCo(p,iVar14), pGVar8 != (Gia_Obj_t *)0x0))) {
    iVar14 = iVar14 + 1;
    if (((undefined1  [12])*pGVar8 & (undefined1  [12])0x4000000040000000) != (undefined1  [12])0x0)
    {
      __assert_fail("!pObj->fMark0 && !pObj->fMark1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                    ,0x36e,"Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
    }
  }
  iVar14 = 0;
  while ((iVar14 < p->nObjs && (pGVar8 = Gia_ManObj(p,iVar14), pGVar8 != (Gia_Obj_t *)0x0))) {
    uVar12 = *(ulong *)pGVar8;
    uVar13 = uVar12 & 0x1fffffff;
    if (uVar13 != 0x1fffffff && -1 < (int)(uint)uVar12) {
      if ((~uVar12 & 0x4000000040000000) == 0) {
        __assert_fail("!pObj->fMark0 || !pObj->fMark1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                      ,0x371,"Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
      }
      if (((uint)uVar12 >> 0x1e & 1) != 0) {
        if ((long)*(ulong *)(pGVar8 + -uVar13) < 0) {
          __assert_fail("Gia_ObjFanin0(pObj)->fPhase == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                        ,0x374,"Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)")
          ;
        }
        *(ulong *)(pGVar8 + -uVar13) = *(ulong *)(pGVar8 + -uVar13) | 0x8000000000000000;
        uVar12 = *(ulong *)pGVar8;
      }
      if ((uVar12 & 0x4000000000000000) != 0) {
        uVar12 = (ulong)((uint)(uVar12 >> 0x20) & 0x1fffffff);
        if ((long)*(ulong *)(pGVar8 + -uVar12) < 0) {
          __assert_fail("Gia_ObjFanin1(pObj)->fPhase == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                        ,0x379,"Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)")
          ;
        }
        *(ulong *)(pGVar8 + -uVar12) = *(ulong *)(pGVar8 + -uVar12) | 0x8000000000000000;
      }
    }
    iVar14 = iVar14 + 1;
  }
  if (fUseFanout == 0) {
    local_58 = Vec_IntStartFull(p->nObjs);
    iVar14 = 0;
    bVar15 = local_58 == (Vec_Int_t *)0x0;
    vCarries = local_58;
    if (!bVar15) {
      Gia_ManCreateRefs(p);
      while ((iVar14 < p->nObjs && (pGVar8 = Gia_ManObj(p,iVar14), pGVar8 != (Gia_Obj_t *)0x0))) {
        uVar12 = *(ulong *)pGVar8;
        uVar13 = uVar12 & 0x1fffffff;
        if (uVar13 != 0x1fffffff && -1 < (int)(uint)uVar12) {
          if (((uint)uVar12 >> 0x1e & 1) == 0) {
            if ((uVar12 & 0x4000000000000000) == 0) goto LAB_004e29ed;
            uVar13 = (ulong)((uint)(uVar12 >> 0x20) & 0x1fffffff);
          }
          Gia_ObjRefDec(p,pGVar8 + -uVar13);
        }
LAB_004e29ed:
        iVar14 = iVar14 + 1;
      }
      goto LAB_004e29f6;
    }
  }
  local_58 = (Vec_Int_t *)0x0;
  bVar15 = true;
LAB_004e29f6:
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar9 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar9;
  pcVar9 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar9;
  p->pObjs->Value = 0;
  iVar14 = 1;
  local_38 = p_00;
  do {
    if ((p->nObjs <= iVar14) || (pGVar8 = Gia_ManObj(p,iVar14), pGVar8 == (Gia_Obj_t *)0x0)) {
      Gia_ManCleanPhase(p);
      Vec_IntFreeP(&vCarries);
      if (p->pRefs != (int *)0x0) {
        free(p->pRefs);
        p->pRefs = (int *)0x0;
      }
      iVar14 = Gia_ManHasDangling(p_00);
      if (iVar14 != 0) {
        __assert_fail("!Gia_ManHasDangling(pNew)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                      ,0x3bc,"Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
      }
      iVar14 = Gia_ManBoxNum(p);
      if (iVar14 == 0) {
        iVar14 = p->vCis->nSize;
      }
      else {
        iVar14 = Tim_ManPiNum((Tim_Man_t *)p->pManTime);
      }
      iVar2 = Gia_ManBoxNum(p);
      if (iVar2 == 0) {
        iVar2 = p->vCos->nSize;
      }
      else {
        iVar2 = Tim_ManPoNum((Tim_Man_t *)p->pManTime);
      }
      pTVar10 = Gia_ManGenerateTim(iVar14,iVar2,local_50,3,2);
      p_00->pManTime = pTVar10;
      pGVar11 = Gia_ManGenerateExtraAig(local_50,3,2);
      p_00->pAigExtra = pGVar11;
      return p_00;
    }
    uVar12 = *(ulong *)pGVar8;
    uVar1 = (uint)uVar12;
    if ((~uVar1 & 0x9fffffff) == 0) {
      uVar1 = Gia_ManAppendCi(p_00);
LAB_004e2af4:
      pGVar8->Value = uVar1;
    }
    else {
      if ((~uVar1 & 0x1fffffff) != 0 && (int)uVar1 < 0) {
        iVar2 = Gia_ObjFanin0Copy(pGVar8);
        uVar1 = Gia_ManAppendCo(p_00,iVar2);
        goto LAB_004e2af4;
      }
      if ((uVar12 & 0x4000000040000000) == 0) {
        iVar2 = Gia_ObjFanin0Copy(pGVar8);
        iVar3 = Gia_ObjFanin1Copy(pGVar8);
        uVar1 = Gia_ManAppendAnd(p_00,iVar2,iVar3);
        goto LAB_004e2af4;
      }
      if (((uint)(uVar12 >> 0x1e) & 1) == (uint)((uVar12 >> 0x3e & 1) != 0)) {
        __assert_fail("pObj->fMark0 != pObj->fMark1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                      ,0x39b,"Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
      }
      if ((uVar12 >> 0x1e & 1) == 0) {
        iVar2 = Gia_ObjFanin1CopyCarry(local_58,pGVar8,iVar14);
      }
      else {
        iVar2 = Gia_ObjFanin0CopyCarry(local_58,pGVar8,iVar14);
      }
      if ((pGVar8->field_0x3 & 0x40) == 0) {
        iVar3 = Gia_ObjFanin0Copy(pGVar8);
      }
      else {
        iVar3 = Gia_ObjFanin1Copy(pGVar8);
      }
      iVar4 = Abc_LitIsCompl(iVar2);
      iVar4 = Abc_LitNotCond(iVar2,iVar4);
      iVar5 = Abc_LitIsCompl(iVar2);
      iVar5 = Abc_LitNotCond(iVar3,iVar5);
      iVar6 = Abc_LitIsCompl(iVar2);
      iVar7 = Abc_LitIsCompl(iVar4);
      p_00 = local_38;
      if (iVar7 != 0) {
        __assert_fail("!Abc_LitIsCompl(iLit0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                      ,0x3a3,"Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
      }
      Gia_ManAppendCo(local_38,iVar4);
      Gia_ManAppendCo(p_00,iVar5);
      Gia_ManAppendCo(p_00,iVar6);
      iVar4 = Gia_ManAppendCi(p_00);
      iVar5 = Gia_ManAppendCi(p_00);
      iVar6 = Abc_LitIsCompl(iVar2);
      uVar1 = Abc_LitNotCond(iVar5,iVar6);
      pGVar8->Value = uVar1;
      if ((!bVar15) && (*(long *)pGVar8 < 0)) {
        Vec_IntWriteEntry(local_58,iVar14,uVar1);
        iVar5 = Gia_ObjId(p,pGVar8);
        if (0 < p->pRefs[iVar5]) {
          if (fXorTrick == 0) {
            iVar2 = Gia_ObjFanin0Copy(pGVar8);
            iVar3 = Gia_ObjFanin1Copy(pGVar8);
          }
          else {
            uVar1 = Abc_LitIsCompl(iVar2);
            iVar2 = Abc_LitNotCond(iVar4,uVar1 ^ 1);
          }
          uVar1 = Gia_ManAppendAnd(p_00,iVar2,iVar3);
          pGVar8->Value = uVar1;
        }
      }
      local_50 = local_50 + 1;
    }
    iVar14 = iVar14 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManDupWithArtificalFaddBoxes( Gia_Man_t * p, int fUseFanout, int fXorTrick )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;  
    int nBoxes = Gia_ManBoxNum(p);
    int i, nRealPis, nRealPos;
    Vec_Int_t * vCarries = NULL;
    // make sure two chains do not overlap
    Gia_ManCleanPhase( p );
    Gia_ManForEachCi( p, pObj, i )
        assert( !pObj->fMark0 && !pObj->fMark1 );
    Gia_ManForEachCo( p, pObj, i )
        assert( !pObj->fMark0 && !pObj->fMark1 );
    Gia_ManForEachAnd( p, pObj, i )
    {
        assert( !pObj->fMark0 || !pObj->fMark1 );
        if ( pObj->fMark0 )
        {
            assert( Gia_ObjFanin0(pObj)->fPhase == 0 );
            Gia_ObjFanin0(pObj)->fPhase = 1;
        }
        if ( pObj->fMark1 )
        {
            assert( Gia_ObjFanin1(pObj)->fPhase == 0 );
            Gia_ObjFanin1(pObj)->fPhase = 1;
        }
    }
    // create mapping for carry-chains
    if ( !fUseFanout )
        vCarries = Vec_IntStartFull( Gia_ManObjNum(p) );
    // create references and discount carries
    if ( vCarries )
    {
        Gia_ManCreateRefs( p );
        Gia_ManForEachAnd( p, pObj, i )
            if ( pObj->fMark0 )
                Gia_ObjRefFanin0Dec( p, pObj );
            else if ( pObj->fMark1 )
                Gia_ObjRefFanin1Dec( p, pObj );
    }
    // if AIG already has (natural) FADD boxes, it should not un-normalized
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( !pObj->fMark0 && !pObj->fMark1 ) // AND-gate
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else // AND-gate with chain
        {
            int iCiLit, iOtherLit, iLit0, iLit1, iLit2, iXorLit;
            assert( pObj->fMark0 != pObj->fMark1 );
            iCiLit    = pObj->fMark0 ? Gia_ObjFanin0CopyCarry(vCarries, pObj, i) : Gia_ObjFanin1CopyCarry(vCarries, pObj, i);
            iOtherLit = pObj->fMark0 ? Gia_ObjFanin1Copy(pObj) : Gia_ObjFanin0Copy(pObj);
            assert( iCiLit >= 0 && iOtherLit >= 0 );
            iLit0 = Abc_LitNotCond( iCiLit,    Abc_LitIsCompl(iCiLit) );
            iLit1 = Abc_LitNotCond( iOtherLit, Abc_LitIsCompl(iCiLit) );
            iLit2 = Abc_LitNotCond( 0,         Abc_LitIsCompl(iCiLit) );
            // add COs
            assert( !Abc_LitIsCompl(iLit0) );
            Gia_ManAppendCo( pNew, iLit0 );
            Gia_ManAppendCo( pNew, iLit1 );
            Gia_ManAppendCo( pNew, iLit2 );
            // add CI (unused sum bit)
            iXorLit = Gia_ManAppendCi(pNew);
            // add CI (carry bit)
            pObj->Value = Abc_LitNotCond( Gia_ManAppendCi(pNew), Abc_LitIsCompl(iCiLit) );
            if ( vCarries && pObj->fPhase )
            {
                Vec_IntWriteEntry( vCarries, i, pObj->Value );
                if ( Gia_ObjRefNum(p, pObj) > 0 )
                {
                    if ( fXorTrick )
                        pObj->Value = Gia_ManAppendAnd( pNew, Abc_LitNotCond(iXorLit, !Abc_LitIsCompl(iCiLit)), iOtherLit );
                    else
                        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
                }
            }
            nBoxes++;
        }
    }
    Gia_ManCleanPhase( p );
    Vec_IntFreeP( &vCarries );
    ABC_FREE( p->pRefs );
    assert( !Gia_ManHasDangling(pNew) );
    // other information
//    nBoxes += (Gia_ManCiNum(pNew) - Gia_ManCiNum(p)) / 2;
//    assert( nBoxes == Gia_ManBoxNum(p) + (Gia_ManCoNum(pNew) - Gia_ManCoNum(p)) / 3 );
    nRealPis = Gia_ManBoxNum(p) ? Tim_ManPiNum((Tim_Man_t *)p->pManTime) : Gia_ManCiNum(p);
    nRealPos = Gia_ManBoxNum(p) ? Tim_ManPoNum((Tim_Man_t *)p->pManTime) : Gia_ManCoNum(p);
    pNew->pManTime  = Gia_ManGenerateTim( nRealPis, nRealPos, nBoxes, 3, 2 );
    pNew->pAigExtra = Gia_ManGenerateExtraAig( nBoxes, 3, 2 );
    // optionally normalize the AIG
    return pNew;
}